

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cTextureGatherTests.cpp
# Opt level: O0

long __thiscall glcts::anon_unknown_0::TriangleDraw::Run(TriangleDraw *this)

{
  float fVar1;
  float fVar2;
  float fVar3;
  bool bVar4;
  GLuint GVar5;
  char *src_vs;
  char *src_fs;
  reference pixels;
  reference pixels_00;
  size_type sVar6;
  float *pfVar7;
  CallLogWrapper *pCVar8;
  Vector<float,_4> local_148;
  undefined1 local_138 [8];
  Vec4 rvec;
  GLfloat *rdata;
  allocator<unsigned_int> local_115;
  uint i;
  undefined1 local_110 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> read;
  GLfloat buffData [16];
  Vector<float,_4> local_b0;
  undefined1 local_a0 [8];
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> data;
  string local_78 [32];
  string local_58 [32];
  GLfloat aGStack_38 [2];
  GLfloat colorf [4];
  GLenum local_1c;
  TriangleDraw *pTStack_18;
  GLenum drawBuffer;
  TriangleDraw *this_local;
  
  pCVar8 = &(this->super_GatherBase).super_TGBase.super_SubcaseBase.super_GLWrapper.
            super_CallLogWrapper;
  pTStack_18 = this;
  glu::CallLogWrapper::glGenFramebuffers(pCVar8,1,&this->fbo);
  glu::CallLogWrapper::glGenRenderbuffers(pCVar8,1,&this->rbo);
  glu::CallLogWrapper::glBindRenderbuffer(pCVar8,0x8d41,this->rbo);
  glu::CallLogWrapper::glRenderbufferStorage(pCVar8,0x8d41,0x8d70,100,100);
  glu::CallLogWrapper::glBindFramebuffer(pCVar8,0x8d40,this->fbo);
  glu::CallLogWrapper::glFramebufferRenderbuffer(pCVar8,0x8d40,0x8ce0,0x8d41,this->rbo);
  local_1c = 0x8ce0;
  glu::CallLogWrapper::glDrawBuffers(pCVar8,1,&local_1c);
  aGStack_38[0] = 0.0;
  aGStack_38[1] = 0.0;
  colorf[0] = 0.0;
  colorf[1] = 0.0;
  glu::CallLogWrapper::glClearBufferfv(pCVar8,0x1800,0,aGStack_38);
  glu::CallLogWrapper::glViewport(pCVar8,0,0,100,100);
  (*(this->super_GatherBase).super_TGBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0x1b])()
  ;
  src_vs = (char *)std::__cxx11::string::c_str();
  (*(this->super_GatherBase).super_TGBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0x1c])
            (local_78);
  src_fs = (char *)std::__cxx11::string::c_str();
  GVar5 = TGBase::CreateProgram((TGBase *)this,src_vs,src_fs);
  this->program = GVar5;
  std::__cxx11::string::~string(local_78);
  std::__cxx11::string::~string(local_58);
  glu::CallLogWrapper::glBindAttribLocation
            (&(this->super_GatherBase).super_TGBase.super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,this->program,0,"Vertex");
  glu::CallLogWrapper::glLinkProgram
            (&(this->super_GatherBase).super_TGBase.super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,this->program);
  bVar4 = TGBase::CheckProgram((TGBase *)this,this->program,(bool *)0x0);
  if (bVar4) {
    pCVar8 = &(this->super_GatherBase).super_TGBase.super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper;
    glu::CallLogWrapper::glUseProgram(pCVar8,this->program);
    glu::CallLogWrapper::glGenTextures(pCVar8,1,&(this->super_GatherBase).tex);
    glu::CallLogWrapper::glBindTexture(pCVar8,0xde1,(this->super_GatherBase).tex);
    tcu::Vector<float,_4>::Vector(&local_b0,0.25,0.5,0.75,1.0);
    std::allocator<tcu::Vector<float,_4>_>::allocator
              ((allocator<tcu::Vector<float,_4>_> *)((long)buffData + 0x3f));
    std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
              ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)local_a0,
               10000,&local_b0,(allocator<tcu::Vector<float,_4>_> *)((long)buffData + 0x3f));
    std::allocator<tcu::Vector<float,_4>_>::~allocator
              ((allocator<tcu::Vector<float,_4>_> *)((long)buffData + 0x3f));
    pixels = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::operator[]
                       ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                        local_a0,0);
    glu::CallLogWrapper::glTexImage2D
              (&(this->super_GatherBase).super_TGBase.super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0xde1,0,0x8814,100,100,0,0x1908,0x1406,pixels);
    glu::CallLogWrapper::glTexParameteri
              (&(this->super_GatherBase).super_TGBase.super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0xde1,0x2802,0x812f);
    glu::CallLogWrapper::glTexParameteri
              (&(this->super_GatherBase).super_TGBase.super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0xde1,0x2803,0x812f);
    glu::CallLogWrapper::glTexParameteri
              (&(this->super_GatherBase).super_TGBase.super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0xde1,0x8072,0x812f);
    glu::CallLogWrapper::glTexParameteri
              (&(this->super_GatherBase).super_TGBase.super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0xde1,0x2800,0x2600);
    glu::CallLogWrapper::glTexParameteri
              (&(this->super_GatherBase).super_TGBase.super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0xde1,0x2801,0x2600);
    glu::CallLogWrapper::glGenVertexArrays
              (&(this->super_GatherBase).super_TGBase.super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,1,&this->vao);
    glu::CallLogWrapper::glBindVertexArray
              (&(this->super_GatherBase).super_TGBase.super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,this->vao);
    glu::CallLogWrapper::glGenBuffers
              (&(this->super_GatherBase).super_TGBase.super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,1,&this->vbo);
    glu::CallLogWrapper::glBindBuffer
              (&(this->super_GatherBase).super_TGBase.super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x8892,this->vbo);
    buffData[10] = 1.0;
    buffData[0xb] = -1.0;
    buffData[0xc] = 0.0;
    buffData[0xd] = 1.0;
    buffData[6] = 1.0;
    buffData[7] = 1.0;
    buffData[8] = 0.0;
    buffData[9] = 1.0;
    buffData[2] = -1.0;
    buffData[3] = -1.0;
    buffData[4] = 0.0;
    buffData[5] = 1.0;
    read.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x3f800000bf800000;
    buffData[0] = 0.0;
    buffData[1] = 1.0;
    glu::CallLogWrapper::glBufferData
              (&(this->super_GatherBase).super_TGBase.super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x8892,0x40,
               &read.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,0x88e4);
    glu::CallLogWrapper::glVertexAttribPointer
              (&(this->super_GatherBase).super_TGBase.super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0,4,0x1406,'\0',0x10,(void *)0x0);
    glu::CallLogWrapper::glEnableVertexAttribArray
              (&(this->super_GatherBase).super_TGBase.super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0);
    glu::CallLogWrapper::glDrawArrays
              (&(this->super_GatherBase).super_TGBase.super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,5,0,4);
    glu::CallLogWrapper::glDisableVertexAttribArray
              (&(this->super_GatherBase).super_TGBase.super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0);
    glu::CallLogWrapper::glDeleteVertexArrays
              (&(this->super_GatherBase).super_TGBase.super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,1,&this->vao);
    glu::CallLogWrapper::glBindBuffer
              (&(this->super_GatherBase).super_TGBase.super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x8892,0);
    glu::CallLogWrapper::glReadBuffer
              (&(this->super_GatherBase).super_TGBase.super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x8ce0);
    i = 0;
    std::allocator<unsigned_int>::allocator(&local_115);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_110,40000,&i,&local_115)
    ;
    std::allocator<unsigned_int>::~allocator(&local_115);
    pixels_00 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                          ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_110,0);
    glu::CallLogWrapper::glReadPixels
              (&(this->super_GatherBase).super_TGBase.super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0,0,100,100,0x8d99,0x1405,pixels_00);
    rdata._4_4_ = 0;
    while( true ) {
      sVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_110);
      if (sVar6 >> 2 <= (ulong)rdata._4_4_) break;
      rvec.m_data._8_8_ =
           std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                     ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_110,
                      (ulong)rdata._4_4_);
      tcu::Vector<float,_4>::Vector
                ((Vector<float,_4> *)local_138,*(float *)rvec.m_data._8_8_,
                 *(float *)(rvec.m_data._8_8_ + 4),*(float *)(rvec.m_data._8_8_ + 8),
                 *(float *)(rvec.m_data._8_8_ + 0xc));
      tcu::Vector<float,_4>::Vector(&local_148,0.75);
      bVar4 = tcu::Vector<float,_4>::operator!=((Vector<float,_4> *)local_138,&local_148);
      if (bVar4) {
        pfVar7 = tcu::Vector<float,_4>::x((Vector<float,_4> *)local_138);
        fVar1 = *pfVar7;
        pfVar7 = tcu::Vector<float,_4>::y((Vector<float,_4> *)local_138);
        fVar2 = *pfVar7;
        pfVar7 = tcu::Vector<float,_4>::z((Vector<float,_4> *)local_138);
        fVar3 = *pfVar7;
        pfVar7 = tcu::Vector<float,_4>::w((Vector<float,_4> *)local_138);
        anon_unknown_0::Output
                  ("Got: %f %f %f %f, expected vec4(0.75)",SUB84((double)fVar1,0),(double)fVar2,
                   (double)fVar3,(double)*pfVar7);
        this_local = (TriangleDraw *)&DAT_ffffffffffffffff;
        goto LAB_013fda10;
      }
      rdata._4_4_ = rdata._4_4_ + 4;
    }
    this_local = (TriangleDraw *)0x0;
LAB_013fda10:
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_110);
    std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::~vector
              ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)local_a0);
  }
  else {
    this_local = (TriangleDraw *)&DAT_ffffffffffffffff;
  }
  return (long)this_local;
}

Assistant:

virtual long Run()
	{
		glGenFramebuffers(1, &fbo);
		glGenRenderbuffers(1, &rbo);
		glBindRenderbuffer(GL_RENDERBUFFER, rbo);
		glRenderbufferStorage(GL_RENDERBUFFER, GL_RGBA32UI, 100, 100);
		glBindFramebuffer(GL_FRAMEBUFFER, fbo);
		glFramebufferRenderbuffer(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_RENDERBUFFER, rbo);
		GLenum drawBuffer = GL_COLOR_ATTACHMENT0;
		glDrawBuffers(1, &drawBuffer);
		GLfloat colorf[4] = { 0, 0, 0, 0 };
		glClearBufferfv(GL_COLOR, 0, colorf);
		glViewport(0, 0, 100, 100);

		program = CreateProgram(VertexShader().c_str(), FragmentShader().c_str());
		glBindAttribLocation(program, 0, "Vertex");
		glLinkProgram(program);
		if (!CheckProgram(program))
			return ERROR;
		glUseProgram(program);

		glGenTextures(1, &tex);
		glBindTexture(GL_TEXTURE_2D, tex);
		std::vector<Vec4> data(100 * 100, Vec4(0.25, 0.5, 0.75, 1));
		glTexImage2D(GL_TEXTURE_2D, 0, GL_RGBA32F, 100, 100, 0, GL_RGBA, GL_FLOAT, &data[0]);
		glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_S, GL_CLAMP_TO_EDGE);
		glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_T, GL_CLAMP_TO_EDGE);
		glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_R, GL_CLAMP_TO_EDGE);
		glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_NEAREST);
		glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_NEAREST);

		glGenVertexArrays(1, &vao);
		glBindVertexArray(vao);
		glGenBuffers(1, &vbo);
		glBindBuffer(GL_ARRAY_BUFFER, vbo);
		GLfloat buffData[16] = { -1, 1, 0, 1, -1, -1, 0, 1, 1, 1, 0, 1, 1, -1, 0, 1 };
		glBufferData(GL_ARRAY_BUFFER, sizeof(buffData), buffData, GL_STATIC_DRAW);
		glVertexAttribPointer(0, 4, GL_FLOAT, GL_FALSE, sizeof(GLfloat) * 4, 0);
		glEnableVertexAttribArray(0);
		glDrawArrays(GL_TRIANGLE_STRIP, 0, 4);
		glDisableVertexAttribArray(0);
		glDeleteVertexArrays(1, &vao);
		glBindBuffer(GL_ARRAY_BUFFER, 0);

		glReadBuffer(GL_COLOR_ATTACHMENT0);
		std::vector<unsigned int> read(100 * 100 * 4, 0);
		glReadPixels(0, 0, 100, 100, GL_RGBA_INTEGER, GL_UNSIGNED_INT, &read[0]);
		for (unsigned int i = 0; i < read.size() / 4; i += 4)
		{
			const GLfloat* rdata = (const GLfloat*)&read[i];
			Vec4		   rvec(rdata[0], rdata[1], rdata[2], rdata[3]);
			if (rvec != Vec4(0.75))
			{
				Output("Got: %f %f %f %f, expected vec4(0.75)", rvec.x(), rvec.y(), rvec.z(), rvec.w());
				return ERROR;
			}
		}

		return NO_ERROR;
	}